

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  undefined8 *puVar1;
  stbi__uint32 b_00;
  stbi__context *s;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  stbi__uint32 sVar6;
  uint uVar7;
  char *pcVar8;
  void *pvVar9;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  int local_74;
  
  z->jfif = 0;
  z->app14_color_transform = -1;
  z->marker = 0xff;
  sVar2 = stbi__get_marker(z);
  if (sVar2 != 0xd8) {
    pcVar8 = "no SOI";
    goto LAB_0013f801;
  }
  if (scan == 1) {
    return 1;
  }
  bVar3 = stbi__get_marker(z);
  while ((bVar3 != 0xc2 && ((bVar3 & 0xfe) != 0xc0))) {
    iVar4 = stbi__process_marker(z,(uint)bVar3);
    if (iVar4 == 0) {
      return 0;
    }
    while (bVar3 = stbi__get_marker(z), bVar3 == 0xff) {
      iVar4 = stbi__at_eof(z->s);
      if (iVar4 != 0) {
        pcVar8 = "no SOF";
        goto LAB_0013f801;
      }
    }
  }
  z->progressive = (uint)(bVar3 == 0xc2);
  s = z->s;
  uVar5 = stbi__get16be(s);
  if (10 < uVar5) {
    sVar2 = stbi__get8(s);
    if (sVar2 != '\b') {
      pcVar8 = "only 8-bit";
      goto LAB_0013f801;
    }
    sVar6 = stbi__get16be(s);
    s->img_y = sVar6;
    if (sVar6 == 0) {
      pcVar8 = "no header height";
      goto LAB_0013f801;
    }
    sVar6 = stbi__get16be(s);
    s->img_x = sVar6;
    if (sVar6 == 0) {
      pcVar8 = "0 width";
      goto LAB_0013f801;
    }
    if (0x1000000 < s->img_y) {
      pcVar8 = "too large";
      goto LAB_0013f801;
    }
    bVar3 = stbi__get8(s);
    if ((4 < bVar3) || ((0x1aU >> (bVar3 & 0x1f) & 1) == 0)) {
      pcVar8 = "bad component count";
      goto LAB_0013f801;
    }
    s->img_n = (uint)bVar3;
    for (lVar10 = 0; (ulong)bVar3 * 0x60 - lVar10 != 0; lVar10 = lVar10 + 0x60) {
      *(undefined8 *)((long)&z->img_comp[0].data + lVar10) = 0;
      *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar10) = 0;
    }
    if (uVar5 == (uint)bVar3 + (uint)bVar3 * 2 + 8) {
      z->rgb = 0;
      piVar15 = &z->img_comp[0].tq;
      lVar10 = 0;
      do {
        uVar5 = s->img_n;
        if ((int)uVar5 <= lVar10) {
          if (scan != 0) {
            return 1;
          }
          sVar6 = s->img_x;
          b_00 = s->img_y;
          uVar16 = 0;
          iVar4 = stbi__mad3sizes_valid(sVar6,b_00,uVar5,0);
          if (iVar4 == 0) {
            *(char **)(in_FS_OFFSET + -0x30) = "too large";
            return 0;
          }
          uVar18 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            uVar18 = uVar16;
          }
          uVar11 = 1;
          uVar13 = 1;
          while( true ) {
            iVar4 = (int)uVar11;
            iVar12 = (int)uVar13;
            if (uVar18 * 0x60 - uVar16 == 0) break;
            uVar5 = *(uint *)((long)&z->img_comp[0].h + uVar16);
            uVar7 = *(uint *)((long)&z->img_comp[0].v + uVar16);
            if (iVar4 < (int)uVar5) {
              uVar11 = (ulong)uVar5;
            }
            if (iVar12 < (int)uVar7) {
              uVar13 = (ulong)uVar7;
            }
            uVar16 = uVar16 + 0x60;
          }
          z->img_h_max = iVar4;
          z->img_v_max = iVar12;
          z->img_mcu_w = iVar4 * 8;
          z->img_mcu_h = iVar12 * 8;
          lVar10 = 0;
          uVar5 = ((sVar6 + iVar4 * 8) - 1) / (uint)(iVar4 * 8);
          z->img_mcu_x = uVar5;
          uVar7 = ((b_00 + iVar12 * 8) - 1) / (uint)(iVar12 * 8);
          z->img_mcu_y = uVar7;
          local_74 = 1;
          while( true ) {
            if (uVar18 * 0x60 == lVar10) {
              return 1;
            }
            iVar17 = *(int *)((long)&z->img_comp[0].h + lVar10);
            iVar14 = *(int *)((long)&z->img_comp[0].v + lVar10);
            *(int *)((long)&z->img_comp[0].x + lVar10) =
                 (int)((iVar17 * sVar6 + iVar4 + -1) / uVar11);
            *(int *)((long)&z->img_comp[0].y + lVar10) =
                 (int)((iVar14 * b_00 + iVar12 + -1) / uVar13);
            iVar17 = iVar17 * uVar5;
            a = iVar17 * 8;
            *(int *)((long)&z->img_comp[0].w2 + lVar10) = a;
            iVar14 = iVar14 * uVar7;
            b = iVar14 * 8;
            *(int *)((long)&z->img_comp[0].h2 + lVar10) = b;
            pvVar9 = stbi__malloc_mad2(a,b,0xf);
            *(undefined8 *)((long)&z->img_comp[0].coeff + lVar10) = 0;
            puVar1 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar10);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(void **)((long)&z->img_comp[0].raw_data + lVar10) = pvVar9;
            why = extraout_EDX;
            if (pvVar9 == (void *)0x0) break;
            *(ulong *)((long)&z->img_comp[0].data + lVar10) =
                 (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
            if (z->progressive != 0) {
              *(int *)((long)&z->img_comp[0].coeff_w + lVar10) = iVar17;
              *(int *)((long)&z->img_comp[0].coeff_h + lVar10) = iVar14;
              pvVar9 = stbi__malloc_mad3(a,b,2,0xf);
              *(void **)((long)&z->img_comp[0].raw_coeff + lVar10) = pvVar9;
              why = extraout_EDX_00;
              if (pvVar9 == (void *)0x0) break;
              *(ulong *)((long)&z->img_comp[0].coeff + lVar10) =
                   (long)pvVar9 + 0xfU & 0xfffffffffffffff0;
            }
            local_74 = local_74 + 1;
            lVar10 = lVar10 + 0x60;
          }
          *(char **)(in_FS_OFFSET + -0x30) = "outofmem";
          stbi__free_jpeg_components(z,local_74,why);
          return 0;
        }
        bVar3 = stbi__get8(s);
        ((anon_struct_96_18_0d0905d3 *)(piVar15 + -3))->id = (uint)bVar3;
        if ((s->img_n == 3) &&
           (bVar3 == *(byte *)((long)&stbi__process_frame_header(stbi__jpeg*,int)::rgb + lVar10))) {
          z->rgb = z->rgb + 1;
        }
        bVar3 = stbi__get8(s);
        piVar15[-2] = (uint)(bVar3 >> 4);
        if ((byte)(bVar3 + 0xb0) < 0xc0) {
          pcVar8 = "bad H";
          goto LAB_0013f801;
        }
        piVar15[-1] = bVar3 & 0xf;
        if ((bVar3 & 0xf) - 5 < 0xfffffffc) {
          pcVar8 = "bad V";
          goto LAB_0013f801;
        }
        bVar3 = stbi__get8(s);
        *piVar15 = (uint)bVar3;
        lVar10 = lVar10 + 1;
        piVar15 = piVar15 + 0x18;
      } while (bVar3 < 4);
      pcVar8 = "bad TQ";
      goto LAB_0013f801;
    }
  }
  pcVar8 = "bad SOF len";
LAB_0013f801:
  *(char **)(in_FS_OFFSET + -0x30) = pcVar8;
  return 0;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->jfif = 0;
   z->app14_color_transform = -1; // valid values are 0,1,2
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}